

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O3

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *q)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  secp256k1_ge *psVar5;
  secp256k1_ge *a_00;
  secp256k1_ge *psVar6;
  uint uVar7;
  ulong uVar8;
  secp256k1_fe *psVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  uint negative;
  secp256k1_scalar v1;
  secp256k1_scalar v2;
  secp256k1_ge t;
  secp256k1_fe global_z;
  secp256k1_scalar s;
  secp256k1_ge pre_a_lam [16];
  secp256k1_ge pre_a [16];
  ulong local_e78;
  undefined1 local_e68 [32];
  undefined1 local_e48 [88];
  uint64_t uStack_df0;
  uint64_t local_de8;
  uint64_t uStack_de0;
  uint64_t local_dd8;
  int iStack_dd0;
  int iStack_dcc;
  secp256k1_fe local_dc8;
  undefined4 local_d98;
  secp256k1_fe local_d88;
  secp256k1_scalar local_d58;
  secp256k1_ge local_d38;
  secp256k1_fe asStack_ca0 [31];
  secp256k1_ge local_6b8;
  secp256k1_fe asStack_620 [31];
  
  bVar1 = 0;
  secp256k1_ge_verify(a);
  if (a->infinity != 0) {
    secp256k1_gej_set_infinity(r);
    return;
  }
  secp256k1_scalar_add(&local_d58,q,&secp256k1_ecmult_const_K);
  secp256k1_scalar_half(&local_d58,&local_d58);
  secp256k1_scalar_split_lambda
            ((secp256k1_scalar *)local_e68,(secp256k1_scalar *)local_e48,&local_d58);
  secp256k1_scalar_add
            ((secp256k1_scalar *)local_e68,(secp256k1_scalar *)local_e68,
             &secp256k1_ecmult_const::S_OFFSET);
  psVar5 = (secp256k1_ge *)local_e48;
  secp256k1_scalar_add
            ((secp256k1_scalar *)local_e48,(secp256k1_scalar *)local_e48,
             &secp256k1_ecmult_const::S_OFFSET);
  uVar8 = 0x81;
  while( true ) {
    a_00 = (secp256k1_ge *)local_e68;
    secp256k1_scalar_verify((secp256k1_scalar *)local_e68);
    if ((*(ulong *)(local_e68 + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) != 0) break;
    a_00 = (secp256k1_ge *)local_e48;
    secp256k1_scalar_verify((secp256k1_scalar *)local_e48);
    if ((*(ulong *)(local_e48 + (uVar8 >> 6) * 8) & 1L << ((byte)uVar8 & 0x3f)) != 0)
    goto LAB_0014944b;
    uVar7 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar7;
    if (uVar7 == 0x100) {
      secp256k1_gej_set_ge(r,a);
      secp256k1_ecmult_odd_multiples_table(0x10,&local_6b8,&local_d38.x,&local_d88,r);
      secp256k1_ge_table_set_globalz(0x10,&local_6b8,&local_d38.x);
      lVar3 = 0;
      do {
        secp256k1_ge_mul_lambda
                  ((secp256k1_ge *)((long)local_d38.x.n + lVar3),
                   (secp256k1_ge *)((long)local_6b8.x.n + lVar3));
        lVar3 = lVar3 + 0x68;
      } while (lVar3 != 0x680);
      iVar10 = 0x19;
      psVar5 = (secp256k1_ge *)(local_e48 + 0x50);
      do {
        secp256k1_scalar_verify((secp256k1_scalar *)local_e68);
        uVar7 = iVar10 * 5 + 4U >> 6;
        uVar4 = (uint)(iVar10 * 5) >> 6;
        bVar1 = (byte)(iVar10 * 5) & 0x3f;
        if (uVar7 == uVar4) {
          secp256k1_scalar_verify((secp256k1_scalar *)local_e68);
          uVar7 = uVar7 << 3;
          uVar11 = *(ulong *)(local_e68 + uVar7) >> bVar1;
          secp256k1_scalar_verify((secp256k1_scalar *)local_e48);
          secp256k1_scalar_verify((secp256k1_scalar *)local_e48);
          local_e78 = *(ulong *)(local_e48 + uVar7) >> bVar1;
        }
        else {
          uVar8 = (ulong)(uVar4 << 3);
          uVar11 = *(ulong *)(local_e68 + uVar8) >> bVar1 |
                   *(long *)(local_e68 + uVar8 + 8) << 0x40 - bVar1;
          secp256k1_scalar_verify((secp256k1_scalar *)local_e48);
          local_e78 = *(ulong *)(local_e48 + uVar8) >> bVar1 |
                      *(long *)(local_e48 + uVar8 + 8) << 0x40 - bVar1;
        }
        uVar7 = (uint)((uVar11 & 0x10) == 0);
        local_dd8 = local_6b8.x.n[4];
        iStack_dd0 = local_6b8.x.magnitude;
        iStack_dcc = local_6b8.x.normalized;
        local_de8 = local_6b8.x.n[2];
        uStack_de0 = local_6b8.x.n[3];
        local_e48._80_8_ = local_6b8.x.n[0];
        uStack_df0 = local_6b8.x.n[1];
        local_dc8.n[0] = local_6b8.y.n[0];
        local_dc8.n[1] = local_6b8.y.n[1];
        local_dc8.n[4] = local_6b8.y.n[4];
        local_dc8.magnitude = local_6b8.y.magnitude;
        local_dc8.normalized = local_6b8.y.normalized;
        local_dc8.n[2] = local_6b8.y.n[2];
        local_dc8.n[3] = local_6b8.y.n[3];
        uVar8 = 1;
        psVar9 = asStack_620;
        do {
          uVar4 = (uint)(((-uVar7 ^ (uint)uVar11) & 0xf) == uVar8);
          secp256k1_fe_cmov((secp256k1_fe *)psVar5,psVar9 + -1,uVar4);
          secp256k1_fe_cmov(&local_dc8,psVar9,uVar4);
          uVar8 = uVar8 + 1;
          psVar9 = (secp256k1_fe *)(psVar9[2].n + 1);
        } while (uVar8 != 0x10);
        local_d98 = 0;
        secp256k1_fe_verify(&local_dc8);
        secp256k1_fe_verify_magnitude(&local_dc8,1);
        local_e48._32_8_ = 0x3ffffbfffff0bc - local_dc8.n[0];
        local_e48._40_8_ = 0x3ffffffffffffc - local_dc8.n[1];
        local_e48._48_8_ = 0x3ffffffffffffc - local_dc8.n[2];
        local_e48._56_8_ = 0x3ffffffffffffc - local_dc8.n[3];
        local_e48._64_8_ = 0x3fffffffffffc - local_dc8.n[4];
        local_e48._72_8_ = 2;
        secp256k1_fe_verify((secp256k1_fe *)(local_e48 + 0x20));
        secp256k1_fe_cmov(&local_dc8,(secp256k1_fe *)(local_e48 + 0x20),uVar7);
        if (iVar10 == 0x19) {
          secp256k1_gej_set_ge(r,psVar5);
        }
        else {
          iVar2 = 5;
          do {
            secp256k1_gej_double(r,r);
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
          secp256k1_gej_add_ge(r,r,psVar5);
        }
        uVar7 = (uint)((local_e78 & 0x10) == 0);
        local_dd8 = local_d38.x.n[4];
        iStack_dd0 = local_d38.x.magnitude;
        iStack_dcc = local_d38.x.normalized;
        local_de8 = local_d38.x.n[2];
        uStack_de0 = local_d38.x.n[3];
        local_e48._80_8_ = local_d38.x.n[0];
        uStack_df0 = local_d38.x.n[1];
        local_dc8.n[0] = local_d38.y.n[0];
        local_dc8.n[1] = local_d38.y.n[1];
        local_dc8.n[4] = local_d38.y.n[4];
        local_dc8.magnitude = local_d38.y.magnitude;
        local_dc8.normalized = local_d38.y.normalized;
        local_dc8.n[2] = local_d38.y.n[2];
        local_dc8.n[3] = local_d38.y.n[3];
        uVar8 = 1;
        psVar9 = asStack_ca0;
        do {
          uVar4 = (uint)(((-uVar7 ^ (uint)local_e78) & 0xf) == uVar8);
          secp256k1_fe_cmov((secp256k1_fe *)psVar5,psVar9 + -1,uVar4);
          secp256k1_fe_cmov(&local_dc8,psVar9,uVar4);
          uVar8 = uVar8 + 1;
          psVar9 = (secp256k1_fe *)(psVar9[2].n + 1);
        } while (uVar8 != 0x10);
        local_d98 = 0;
        secp256k1_fe_verify(&local_dc8);
        secp256k1_fe_verify_magnitude(&local_dc8,1);
        local_e48._32_8_ = 0x3ffffbfffff0bc - local_dc8.n[0];
        local_e48._40_8_ = 0x3ffffffffffffc - local_dc8.n[1];
        local_e48._48_8_ = 0x3ffffffffffffc - local_dc8.n[2];
        local_e48._56_8_ = 0x3ffffffffffffc - local_dc8.n[3];
        local_e48._64_8_ = 0x3fffffffffffc - local_dc8.n[4];
        local_e48._72_8_ = 2;
        secp256k1_fe_verify((secp256k1_fe *)(local_e48 + 0x20));
        secp256k1_fe_cmov(&local_dc8,(secp256k1_fe *)(local_e48 + 0x20),uVar7);
        secp256k1_gej_add_ge(r,r,psVar5);
        bVar12 = iVar10 != 0;
        iVar10 = iVar10 + -1;
      } while (bVar12);
      secp256k1_fe_mul(&r->z,&r->z,&local_d88);
      return;
    }
  }
  secp256k1_ecmult_const_cold_1();
LAB_0014944b:
  secp256k1_ecmult_const_cold_2();
  secp256k1_ge_verify(psVar5);
  psVar6 = a_00;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    (psVar6->x).n[0] = (psVar5->x).n[0];
    psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar1 * -0x10 + 8);
    psVar6 = (secp256k1_ge *)((long)psVar6 + (ulong)bVar1 * -0x10 + 8);
  }
  secp256k1_fe_mul(&a_00->x,&a_00->x,&secp256k1_const_beta);
  secp256k1_ge_verify(a_00);
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *q) {
    /* The approach below combines the signed-digit logic from Mike Hamburg's
     * "Fast and compact elliptic-curve cryptography" (https://eprint.iacr.org/2012/309)
     * Section 3.3, with the GLV endomorphism.
     *
     * The idea there is to interpret the bits of a scalar as signs (1 = +, 0 = -), and compute a
     * point multiplication in that fashion. Let v be an n-bit non-negative integer (0 <= v < 2^n),
     * and v[i] its i'th bit (so v = sum(v[i] * 2^i, i=0..n-1)). Then define:
     *
     *   C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *
     * Then it holds that C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *                              = (2*sum(v[i] * 2^i, i=0..l-1) + 1 - 2^l) * A
     *                              = (2*v + 1 - 2^l) * A
     *
     * Thus, one can compute q*A as C_256((q + 2^256 - 1) / 2, A). This is the basis for the
     * paper's signed-digit multi-comb algorithm for multiplication using a precomputed table.
     *
     * It is appealing to try to combine this with the GLV optimization: the idea that a scalar
     * s can be written as s1 + lambda*s2, where lambda is a curve-specific constant such that
     * lambda*A is easy to compute, and where s1 and s2 are small. In particular we have the
     * secp256k1_scalar_split_lambda function which performs such a split with the resulting s1
     * and s2 in range (-2^128, 2^128) mod n. This does work, but is uninteresting:
     *
     *   To compute q*A:
     *   - Let s1, s2 = split_lambda(q)
     *   - Let R1 = C_256((s1 + 2^256 - 1) / 2, A)
     *   - Let R2 = C_256((s2 + 2^256 - 1) / 2, lambda*A)
     *   - Return R1 + R2
     *
     * The issue is that while s1 and s2 are small-range numbers, (s1 + 2^256 - 1) / 2 (mod n)
     * and (s2 + 2^256 - 1) / 2 (mod n) are not, undoing the benefit of the splitting.
     *
     * To make it work, we want to modify the input scalar q first, before splitting, and then only
     * add a 2^128 offset of the split results (so that they end up in the single 129-bit range
     * [0,2^129]). A slightly smaller offset would work due to the bounds on the split, but we pick
     * 2^128 for simplicity. Let s be the scalar fed to split_lambda, and f(q) the function to
     * compute it from q:
     *
     *   To compute q*A:
     *   - Compute s = f(q)
     *   - Let s1, s2 = split_lambda(s)
     *   - Let v1 = s1 + 2^128 (mod n)
     *   - Let v2 = s2 + 2^128 (mod n)
     *   - Let R1 = C_l(v1, A)
     *   - Let R2 = C_l(v2, lambda*A)
     *   - Return R1 + R2
     *
     * l will thus need to be at least 129, but we may overshoot by a few bits (see
     * further), so keep it as a variable.
     *
     * To solve for s, we reason:
     *     q*A  = R1 + R2
     * <=> q*A  = C_l(s1 + 2^128, A) + C_l(s2 + 2^128, lambda*A)
     * <=> q*A  = (2*(s1 + 2^128) + 1 - 2^l) * A + (2*(s2 + 2^128) + 1 - 2^l) * lambda*A
     * <=> q*A  = (2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda)) * A
     * <=> q    = 2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> q    = 2*s + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> s    = (q + (2^l - 2^129 - 1) * (1 + lambda)) / 2 (mod n)
     * <=> f(q) = (q + K) / 2 (mod n)
     *            where K = (2^l - 2^129 - 1)*(1 + lambda) (mod n)
     *
     * We will process the computation of C_l(v1, A) and C_l(v2, lambda*A) in groups of
     * ECMULT_CONST_GROUP_SIZE, so we set l to the smallest multiple of ECMULT_CONST_GROUP_SIZE
     * that is not less than 129; this equals ECMULT_CONST_BITS.
     */

    /* The offset to add to s1 and s2 to make them non-negative. Equal to 2^128. */
    static const secp256k1_scalar S_OFFSET = SECP256K1_SCALAR_CONST(0, 0, 0, 1, 0, 0, 0, 0);
    secp256k1_scalar s, v1, v2;
    secp256k1_ge pre_a[ECMULT_CONST_TABLE_SIZE];
    secp256k1_ge pre_a_lam[ECMULT_CONST_TABLE_SIZE];
    secp256k1_fe global_z;
    int group, i;

    /* We're allowed to be non-constant time in the point, and the code below (in particular,
     * secp256k1_ecmult_const_odd_multiples_table_globalz) cannot deal with infinity in a
     * constant-time manner anyway. */
    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* Compute v1 and v2. */
    secp256k1_scalar_add(&s, q, &secp256k1_ecmult_const_K);
    secp256k1_scalar_half(&s, &s);
    secp256k1_scalar_split_lambda(&v1, &v2, &s);
    secp256k1_scalar_add(&v1, &v1, &S_OFFSET);
    secp256k1_scalar_add(&v2, &v2, &S_OFFSET);

#ifdef VERIFY
    /* Verify that v1 and v2 are in range [0, 2^129-1]. */
    for (i = 129; i < 256; ++i) {
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v1, i, 1) == 0);
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v2, i, 1) == 0);
    }
#endif

    /* Calculate odd multiples of A and A*lambda.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in global_z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_const_odd_multiples_table_globalz(pre_a, &global_z, r);
    for (i = 0; i < ECMULT_CONST_TABLE_SIZE; i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* Next, we compute r = C_l(v1, A) + C_l(v2, lambda*A).
     *
     * We proceed in groups of ECMULT_CONST_GROUP_SIZE bits, operating on that many bits
     * at a time, from high in v1, v2 to low. Call these bits1 (from v1) and bits2 (from v2).
     *
     * Now note that ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1) loads into t a point equal
     * to C_{ECMULT_CONST_GROUP_SIZE}(bits1, A), and analogously for pre_lam_a / bits2.
     * This means that all we need to do is add these looked up values together, multiplied
     * by 2^(ECMULT_GROUP_SIZE * group).
     */
    for (group = ECMULT_CONST_GROUPS - 1; group >= 0; --group) {
        /* Using the _var get_bits function is ok here, since it's only variable in offset and count, not in the scalar. */
        unsigned int bits1 = secp256k1_scalar_get_bits_var(&v1, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        unsigned int bits2 = secp256k1_scalar_get_bits_var(&v2, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        secp256k1_ge t;
        int j;

        ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1);
        if (group == ECMULT_CONST_GROUPS - 1) {
            /* Directly set r in the first iteration. */
            secp256k1_gej_set_ge(r, &t);
        } else {
            /* Shift the result so far up. */
            for (j = 0; j < ECMULT_CONST_GROUP_SIZE; ++j) {
                secp256k1_gej_double(r, r);
            }
            secp256k1_gej_add_ge(r, r, &t);
        }
        ECMULT_CONST_TABLE_GET_GE(&t, pre_a_lam, bits2);
        secp256k1_gej_add_ge(r, r, &t);
    }

    /* Map the result back to the secp256k1 curve from the isomorphic curve. */
    secp256k1_fe_mul(&r->z, &r->z, &global_z);
}